

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu382_setup_colmv_buf(void *hal,HalTaskInfo *task)

{
  RK_S32 RVar1;
  RK_U32 local_5c;
  size_t local_58;
  size_t size;
  RK_U32 compress;
  RK_S32 colmv_byte;
  RK_S32 colmv_size;
  RK_S32 mv_size;
  RK_U32 height;
  RK_U32 width;
  DXVA_PicParams_VP9 *pic_param;
  Vdpu382Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  HalTaskInfo *task_local;
  void *hal_local;
  
  pic_param = *(DXVA_PicParams_VP9 **)((long)hal + 0x40);
  _height = (task->dec).syntax.data;
  mv_size = *(RK_U32 *)((long)_height + 4);
  colmv_size = *(RK_U32 *)((long)_height + 8);
  colmv_byte = 0;
  compress = 8;
  size._4_4_ = 0x10;
  if (*(long *)((long)hal + 0x48) == 0) {
    local_5c = 1;
  }
  else {
    local_5c = (uint)(*(ulong *)(*(long *)((long)hal + 0x48) + 4) >> 0xe) & 1;
  }
  size._0_4_ = local_5c;
  hw_ctx = (Vdpu382Vp9dCtx *)hal;
  p_hal = (HalVp9dCtx *)task;
  task_local = (HalTaskInfo *)hal;
  colmv_byte = vdpu382_get_colmv_size(mv_size,colmv_size,0x40,0x10,8,local_5c);
  if ((*(long *)((pic_param->prob).partition[2] + 3) == 0) ||
     (*(int *)((pic_param->prob).partition[3][1] + 2) < colmv_byte)) {
    local_58 = (size_t)colmv_byte;
    if (*(long *)((pic_param->prob).partition[2] + 3) != 0) {
      hal_bufs_deinit(*(HalBufs *)((pic_param->prob).partition[2] + 3));
      *(undefined8 *)((pic_param->prob).partition[2] + 3) = 0;
    }
    hal_bufs_init((HalBufs *)((pic_param->prob).partition[2] + 3));
    if (*(long *)((pic_param->prob).partition[2] + 3) == 0) {
      _mpp_log_l(2,"hal_vp9d_vdpu382","colmv bufs init fail","hal_vp9d_vdpu382_setup_colmv_buf");
      return MPP_ERR_NOMEM;
    }
    *(RK_S32 *)((pic_param->prob).partition[3][1] + 2) = colmv_byte;
    RVar1 = mpp_buf_slot_get_count(hw_ctx->g_buf[0].count_base);
    *(RK_S32 *)((pic_param->prob).partition[3] + 3) = RVar1;
    hal_bufs_setup(*(HalBufs *)((pic_param->prob).partition[2] + 3),
                   *(RK_S32 *)((pic_param->prob).partition[3] + 3),1,&local_58);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_setup_colmv_buf(void *hal, HalTaskInfo *task)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;
    RK_U32 width = pic_param->width;
    RK_U32 height = pic_param->height;
    RK_S32 mv_size = 0, colmv_size = 8, colmv_byte = 16;
    RK_U32 compress = p_hal->hw_info ? p_hal->hw_info->cap_colmv_compress : 1;

    mv_size = vdpu382_get_colmv_size(width, height, VP9_CTU_SIZE, colmv_byte, colmv_size, compress);
    if (hw_ctx->cmv_bufs == NULL || hw_ctx->mv_size < mv_size) {
        size_t size = mv_size;

        if (hw_ctx->cmv_bufs) {
            hal_bufs_deinit(hw_ctx->cmv_bufs);
            hw_ctx->cmv_bufs = NULL;
        }

        hal_bufs_init(&hw_ctx->cmv_bufs);
        if (hw_ctx->cmv_bufs == NULL) {
            mpp_err_f("colmv bufs init fail");
            return MPP_ERR_NOMEM;
        }
        hw_ctx->mv_size = mv_size;
        hw_ctx->mv_count = mpp_buf_slot_get_count(p_hal ->slots);
        hal_bufs_setup(hw_ctx->cmv_bufs, hw_ctx->mv_count, 1, &size);
    }

    return MPP_OK;
}